

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swapproc.c
# Opt level: O0

size_t get_peel(void *addr,size_t esize,size_t nvals,size_t alignment)

{
  undefined8 local_40;
  undefined8 local_38;
  size_t peel;
  size_t offset;
  size_t alignment_local;
  size_t nvals_local;
  size_t esize_local;
  void *addr_local;
  
  if ((ulong)addr % alignment == 0) {
    local_38 = 0;
  }
  else {
    local_38 = (alignment - (ulong)addr % alignment) / esize;
  }
  local_40 = nvals;
  if (local_38 <= nvals) {
    local_40 = local_38;
  }
  return local_40;
}

Assistant:

static inline size_t get_peel(void * addr, size_t esize, size_t nvals,
                              size_t alignment)
{
    const size_t offset = (size_t)addr % alignment;
    size_t peel = offset ? (alignment - offset) / esize : 0;
    peel = nvals < peel ? nvals : peel;
    return peel;
}